

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_revisiondate(lysp_yang_ctx *ctx,char *rev,lysp_ext_instance **exts)

{
  size_t __n;
  LY_ERR LVar1;
  char *format;
  ly_ctx *plVar2;
  char *pcVar3;
  bool bVar4;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  
  if (*rev == '\0') {
    LVar1 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&word,&buf,&word_len);
    pcVar3 = word;
    __n = word_len;
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    LVar1 = lysp_check_date((lysp_ctx *)ctx,word,word_len,"revision-date");
    if (LVar1 != LY_SUCCESS) {
      free(buf);
      return LY_EVALID;
    }
    strncpy(rev,pcVar3,__n);
    free(buf);
    LVar1 = get_keyword(ctx,&kw,&word,&word_len);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if (kw == LY_STMT_SYNTAX_SEMICOLON) {
      bVar4 = true;
    }
    else {
      if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar2 = (ly_ctx *)0x0;
        }
        else {
          plVar2 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar3 = lyplg_ext_stmt2str(kw);
        format = "Invalid keyword \"%s\", expected \";\" or \"{\".";
        goto LAB_00179f36;
      }
      LVar1 = get_keyword(ctx,&kw,&word,&word_len);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      bVar4 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
    }
    while( true ) {
      if (bVar4) {
        return LY_SUCCESS;
      }
      if (kw != LY_STMT_EXTENSION_INSTANCE) break;
      LVar1 = parse_ext(ctx,word,word_len,rev,LY_STMT_REVISION_DATE,0,exts);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      LVar1 = get_keyword(ctx,&kw,&word,&word_len);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      bVar4 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar2 = (ly_ctx *)0x0;
    }
    else {
      plVar2 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar3 = lyplg_ext_stmt2str(kw);
    ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
            pcVar3,"revision-date");
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar2 = (ly_ctx *)0x0;
    }
    else {
      plVar2 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Duplicate keyword \"%s\".";
    pcVar3 = "revision-date";
LAB_00179f36:
    ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar3);
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
parse_revisiondate(struct lysp_yang_ctx *ctx, char *rev, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (rev[0]) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "revision-date");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    /* check value */
    if (lysp_check_date((struct lysp_ctx *)ctx, word, word_len, "revision-date")) {
        free(buf);
        return LY_EVALID;
    }

    /* store value and spend buf if allocated */
    strncpy(rev, word, word_len);
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, rev, LY_STMT_REVISION_DATE, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "revision-date");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}